

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.h
# Opt level: O0

void __thiscall phyr::OrenNayar::OrenNayar(OrenNayar *this,Spectrum *R,double sigma)

{
  void *in_RSI;
  BxDF *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double sigma2;
  
  BxDF::BxDF(in_RDI,BSDF_DIFFUSE|BSDF_REFLECTION);
  in_RDI->_vptr_BxDF = (_func_int **)&PTR__OrenNayar_0028b7a8;
  memcpy(in_RDI + 1,in_RSI,0x1e0);
  dVar1 = radians(in_XMM0_Qa);
  dVar1 = dVar1 * dVar1;
  in_RDI[0x1f]._vptr_BxDF = (_func_int **)(1.0 - dVar1 / ((dVar1 + 0.33000001311302185) * 2.0));
  *(double *)&in_RDI[0x1f].type = (dVar1 * 0.44999998807907104) / (dVar1 + 0.09000000357627869);
  return;
}

Assistant:

OrenNayar(const Spectrum& R, Real sigma)
        : BxDF(BxDFType(BSDF_REFLECTION | BSDF_DIFFUSE)), R(R) {
        sigma = radians(sigma);
        Real sigma2 = sigma * sigma;
        A = 1.f - (sigma2 / (2.f * (sigma2 + 0.33f)));
        B = 0.45f * sigma2 / (sigma2 + 0.09f);
    }